

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O2

void __thiscall cppnet::LogStream::LogStream(LogStream *this,LogStreamParam *param)

{
  std::__shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2> *)param);
  std::function<void_(std::shared_ptr<cppnet::Log>)>::function(&this->_call_back,&param->second);
  return;
}

Assistant:

LogStream::LogStream(const LogStreamParam& param):
    _log(param.first),
    _call_back(param.second) {

}